

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O0

uint64_t kratos::XXHash64::hash(void *input,uint64_t length,uint64_t seed)

{
  uint64_t uVar1;
  undefined1 local_70 [8];
  XXHash64 hasher;
  uint64_t seed_local;
  uint64_t length_local;
  void *input_local;
  
  hasher.totalLength = seed;
  XXHash64((XXHash64 *)local_70,seed);
  add((XXHash64 *)local_70,input,length);
  uVar1 = hash((XXHash64 *)local_70);
  return uVar1;
}

Assistant:

static uint64_t hash(const void* input, uint64_t length, uint64_t seed) {
        XXHash64 hasher(seed);
        hasher.add(input, length);
        return hasher.hash();
    }